

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O1

int archive_read_format_ar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  size_t *psVar1;
  size_t in_RAX;
  void *pvVar2;
  int64_t iVar3;
  int iVar4;
  ssize_t bytes_read;
  size_t local_38;
  
  psVar1 = (size_t *)a->format->data;
  local_38 = in_RAX;
  if (psVar1[1] != 0) {
    __archive_read_consume(a,psVar1[1]);
    psVar1[1] = 0;
  }
  if ((long)*psVar1 < 1) {
    iVar3 = __archive_read_consume(a,psVar1[3]);
    if (-1 < iVar3) {
      psVar1[3] = psVar1[3] - iVar3;
    }
    if (psVar1[3] == 0) {
      *buff = (void *)0x0;
      *size = 0;
      *offset = psVar1[2];
      iVar4 = 1;
    }
    else {
      iVar4 = -0x1e;
      if (-1 < iVar3) {
        archive_set_error(&a->archive,-1,"Truncated ar archive - failed consuming padding");
      }
    }
  }
  else {
    pvVar2 = __archive_read_ahead(a,1,(ssize_t *)&local_38);
    *buff = pvVar2;
    if (local_38 == 0) {
      archive_set_error(&a->archive,-1,"Truncated ar archive");
    }
    else if (-1 < (long)local_38) {
      if ((long)*psVar1 < (long)local_38) {
        local_38 = *psVar1;
      }
      *size = local_38;
      psVar1[1] = local_38;
      *offset = psVar1[2];
      psVar1[2] = psVar1[2] + local_38;
      *psVar1 = *psVar1 - local_38;
      return 0;
    }
    iVar4 = -0x1e;
  }
  return iVar4;
}

Assistant:

static int
archive_read_format_ar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct ar *ar;

	ar = (struct ar *)(a->format->data);

	if (ar->entry_bytes_unconsumed) {
		__archive_read_consume(a, ar->entry_bytes_unconsumed);
		ar->entry_bytes_unconsumed = 0;
	}

	if (ar->entry_bytes_remaining > 0) {
		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read == 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated ar archive");
			return (ARCHIVE_FATAL);
		}
		if (bytes_read < 0)
			return (ARCHIVE_FATAL);
		if (bytes_read > ar->entry_bytes_remaining)
			bytes_read = (ssize_t)ar->entry_bytes_remaining;
		*size = bytes_read;
		ar->entry_bytes_unconsumed = bytes_read;
		*offset = ar->entry_offset;
		ar->entry_offset += bytes_read;
		ar->entry_bytes_remaining -= bytes_read;
		return (ARCHIVE_OK);
	} else {
		int64_t skipped = __archive_read_consume(a, ar->entry_padding);
		if (skipped >= 0) {
			ar->entry_padding -= skipped;
		}
		if (ar->entry_padding) {
			if (skipped >= 0) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
					"Truncated ar archive - failed consuming padding");
			}
			return (ARCHIVE_FATAL);
		}
		*buff = NULL;
		*size = 0;
		*offset = ar->entry_offset;
		return (ARCHIVE_EOF);
	}
}